

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

Range<int,_3> * __thiscall
Nova::Grid<float,_3>::Node_Indices
          (Range<int,_3> *__return_storage_ptr__,Grid<float,_3> *this,int number_of_ghost_cells)

{
  undefined1 local_4c [56];
  int number_of_ghost_cells_local;
  Grid<float,_3> *this_local;
  
  local_4c._48_4_ = number_of_ghost_cells;
  unique0x100000c8 = this;
  this_local = (Grid<float,_3> *)__return_storage_ptr__;
  Vector<int,_3,_true>::Vector((Vector<int,_3,_true> *)(local_4c + 0xc),1);
  Number_Of_Nodes((Grid<float,_3> *)local_4c);
  Range<int,_3>::Range((Range<int,_3> *)(local_4c + 0x18),(TV *)(local_4c + 0xc),(TV *)local_4c);
  Range<int,_3>::Thickened
            (__return_storage_ptr__,(Range<int,_3> *)(local_4c + 0x18),local_4c._48_4_);
  return __return_storage_ptr__;
}

Assistant:

Range<int,d> Node_Indices(const int number_of_ghost_cells=0) const
    {return Range<int,d>(T_INDEX(1),Number_Of_Nodes()).Thickened(number_of_ghost_cells);}